

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O1

void * If_ManSatBuildXY(int nLutSize)

{
  uint uVar1;
  int iVar2;
  sat_solver *s;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 in_register_0000003c;
  ulong uVar8;
  uint uVar9;
  int local_78;
  int local_74;
  uint local_70;
  uint local_6c;
  sat_solver *local_68;
  int local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  undefined8 local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = CONCAT44(in_register_0000003c,nLutSize);
  iVar6 = nLutSize * 2 + -1;
  uVar3 = 1 << ((byte)iVar6 & 0x1f);
  local_6c = 1;
  uVar1 = 2 << ((byte)nLutSize & 0x1f);
  local_58 = (ulong)uVar1;
  s = sat_solver_new();
  sat_solver_setnvars(s,uVar3 + uVar1);
  if (iVar6 != 0x1f) {
    if (1 < (int)uVar3) {
      local_6c = uVar3;
    }
    uVar1 = (int)local_58 * 2;
    uVar8 = 0;
    local_68 = s;
    local_50 = (ulong)(uint)(1 << ((byte)nLutSize & 0x1f));
    do {
      uVar7 = (uint)uVar8;
      uVar3 = uVar7 >> ((byte)local_48 & 0x1f);
      iVar6 = (int)local_50;
      uVar9 = iVar6 + uVar3 * 2;
      uVar3 = iVar6 + uVar3 * 2 + 1;
      if ((int)((int)local_58 + uVar7 | uVar9 | uVar3) < 0) {
        __assert_fail("iVarC >= 0 && iVarT >= 0 && iVarE >= 0 && iVarZ >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x193,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      iVar4 = ((int)uVar7 % iVar6) * 2 + 1;
      local_74 = uVar3 * 2 + 1;
      local_78 = iVar4;
      local_70 = uVar1;
      local_5c = local_74;
      local_38 = uVar8;
      iVar2 = sat_solver_addclause(s,&local_78,(lit *)&local_6c);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x199,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      iVar5 = uVar1 + 1;
      local_78 = iVar4;
      local_74 = uVar3 * 2;
      local_70 = iVar5;
      iVar2 = sat_solver_addclause(local_68,&local_78,(lit *)&local_6c);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x19f,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      iVar6 = ((int)uVar7 % iVar6) * 2;
      local_74 = uVar9 * 2 + 1;
      local_78 = iVar6;
      local_70 = uVar1;
      local_60 = local_74;
      local_40 = (ulong)uVar1;
      iVar2 = sat_solver_addclause(local_68,&local_78,(lit *)&local_6c);
      s = local_68;
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x1a5,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      local_78 = iVar6;
      local_74 = uVar9 * 2;
      local_70 = iVar5;
      iVar6 = sat_solver_addclause(local_68,&local_78,(lit *)&local_6c);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x1ab,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      local_78 = uVar3 * 2;
      local_74 = uVar9 * 2;
      local_70 = iVar5;
      iVar6 = sat_solver_addclause(s,&local_78,(lit *)&local_6c);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x1b4,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      local_78 = local_5c;
      local_74 = local_60;
      iVar2 = (int)local_40;
      local_70 = iVar2;
      iVar6 = sat_solver_addclause(s,&local_78,(lit *)&local_6c);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x1ba,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      uVar3 = (int)local_38 + 1;
      uVar8 = (ulong)uVar3;
      uVar1 = iVar2 + 2;
    } while (local_6c != uVar3);
  }
  return s;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Builds SAT instance for the given structure.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void * If_ManSatBuildXY( int nLutSize )
{
    int nMintsL = (1 << nLutSize);
    int nMintsF = (1 << (2 * nLutSize - 1));
    int nVars   = 2 * nMintsL + nMintsF;
    int iVarP0  = 0;           // LUT0 parameters (total nMintsL)
    int iVarP1  = nMintsL;     // LUT1 parameters (total nMintsL)
    int m,iVarM = 2 * nMintsL; // MUX vars        (total nMintsF)
    sat_solver * p = sat_solver_new();
    sat_solver_setnvars( p, nVars );
    for ( m = 0; m < nMintsF; m++ )
        sat_solver_add_mux( p, 
            iVarM  + m, 
            iVarP0 + m % nMintsL, 
            iVarP1 + 2 * (m / nMintsL) + 1, 
            iVarP1 + 2 * (m / nMintsL), 
            0, 0, 0, 0 );
    return p;
}